

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

void parse_escapes(char *src,mtree_entry *mentry)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  
  if ((mentry != (mtree_entry *)0x0) && (iVar3 = strcmp(src,"."), iVar3 == 0)) {
    mentry->full = '\x01';
  }
  bVar5 = *src;
  pbVar2 = (byte *)src;
  do {
    if (bVar5 == 0) {
      *src = 0;
      return;
    }
    if ((mentry != (mtree_entry *)0x0) && (bVar5 == 0x2f)) {
      mentry->full = '\x01';
    }
    pbVar4 = pbVar2 + 1;
    if (bVar5 == 0x5c) {
      bVar1 = *pbVar4;
      if (bVar1 < 0x62) {
        if (0x5b < bVar1) {
          if (bVar1 == 0x5c) {
            bVar5 = 0x5c;
          }
          else {
            if (bVar1 != 0x61) goto switchD_00409562_caseD_6f;
            bVar5 = 7;
          }
          goto LAB_00409641;
        }
        if (2 < bVar1 - 0x31) {
          if (bVar1 != 0x30) goto switchD_00409562_caseD_6f;
          if ((byte)(pbVar2[2] - 0x38) < 0xf8) {
            bVar5 = 0;
            goto LAB_00409641;
          }
        }
        if (((pbVar2[2] & 0xf8) == 0x30) && ((pbVar2[3] & 0xf8) == 0x30)) {
          bVar5 = (pbVar2[3] + ((pbVar2[2] & 7) << 3 | bVar1 << 6)) - 0x30;
          pbVar4 = pbVar2 + 4;
        }
      }
      else {
        switch(bVar1) {
        case 0x6e:
          bVar5 = 10;
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x75:
          goto switchD_00409562_caseD_6f;
        case 0x72:
          bVar5 = 0xd;
          break;
        case 0x73:
          bVar5 = 0x20;
          break;
        case 0x74:
          bVar5 = 9;
          break;
        case 0x76:
          bVar5 = 0xb;
          break;
        default:
          if (bVar1 == 0x62) {
            bVar5 = 8;
          }
          else {
            if (bVar1 != 0x66) goto switchD_00409562_caseD_6f;
            bVar5 = 0xc;
          }
        }
LAB_00409641:
        pbVar4 = pbVar2 + 2;
      }
    }
switchD_00409562_caseD_6f:
    *src = bVar5;
    src = (char *)((byte *)src + 1);
    bVar5 = *pbVar4;
    pbVar2 = pbVar4;
  } while( true );
}

Assistant:

static void
parse_escapes(char *src, struct mtree_entry *mentry)
{
	char *dest = src;
	char c;

	if (mentry != NULL && strcmp(src, ".") == 0)
		mentry->full = 1;

	while (*src != '\0') {
		c = *src++;
		if (c == '/' && mentry != NULL)
			mentry->full = 1;
		if (c == '\\') {
			switch (src[0]) {
			case '0':
				if (src[1] < '0' || src[1] > '7') {
					c = 0;
					++src;
					break;
				}
				/* FALLTHROUGH */
			case '1':
			case '2':
			case '3':
				if (src[1] >= '0' && src[1] <= '7' &&
				    src[2] >= '0' && src[2] <= '7') {
					c = (src[0] - '0') << 6;
					c |= (src[1] - '0') << 3;
					c |= (src[2] - '0');
					src += 3;
				}
				break;
			case 'a':
				c = '\a';
				++src;
				break;
			case 'b':
				c = '\b';
				++src;
				break;
			case 'f':
				c = '\f';
				++src;
				break;
			case 'n':
				c = '\n';
				++src;
				break;
			case 'r':
				c = '\r';
				++src;
				break;
			case 's':
				c = ' ';
				++src;
				break;
			case 't':
				c = '\t';
				++src;
				break;
			case 'v':
				c = '\v';
				++src;
				break;
			case '\\':
				c = '\\';
				++src;
				break;
			}
		}
		*dest++ = c;
	}
	*dest = '\0';
}